

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::LogSoftmax::forward_impl
          (LogSoftmax *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  uint uVar1;
  size_type sVar2;
  const_reference ppTVar3;
  runtime_error *this_00;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  float logz;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_00000030;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  DenseBase<Eigen::CwiseUnaryOp<cnn::FLogSoftmaxNormalize,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_ffffffffffffff58;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_ffffffffffffff60;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff68;
  Tensor *in_stack_ffffffffffffff88;
  FLogSoftmaxNormalize local_64 [21];
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_10;
  
  local_10 = in_RSI;
  sVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if (sVar2 != 1) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                  ,0x4cb,
                  "virtual void cnn::LogSoftmax::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (local_10,0);
  uVar1 = Dim::cols(&(*ppTVar3)->d);
  if (uVar1 == 1) {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_10,0);
    Tensor::operator*(in_stack_ffffffffffffff88);
    logz = logsumexp<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                     (in_stack_00000030);
    FLogSoftmaxNormalize::FLogSoftmaxNormalize(local_64,logz);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::unaryExpr<cnn::FLogSoftmaxNormalize>
              (in_stack_ffffffffffffff68,(FLogSoftmaxNormalize *)in_stack_ffffffffffffff60);
    Tensor::operator*(in_stack_ffffffffffffff88);
    Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>::operator=
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"LogSoftmax::forward not yet implemented for multiple columns");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LogSoftmax::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() == 1);
  if (xs[0]->d.cols() == 1) {
#if HAVE_CUDA
    throw std::runtime_error("LogSoftmax::forward not yet implemented for CUDA");
#else
    auto x = **xs[0];
    *fx = x.unaryExpr(FLogSoftmaxNormalize(logsumexp(x)));
#endif
  } else {
    throw std::runtime_error("LogSoftmax::forward not yet implemented for multiple columns");
  }
}